

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::GLES2ThreadTest::CreateProgram::CreateProgram
          (CreateProgram *this,SharedPtr<deqp::egl::GLES2ThreadTest::Program> *program,bool useSync,
          bool serverSync)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  Program *this_00;
  SharedPtrStateBase *pSVar3;
  deInt32 *pdVar4;
  SharedPtr<deqp::egl::GLES2ThreadTest::FenceSync> local_50;
  SharedPtr<tcu::ThreadUtil::Event> local_40;
  
  Operation::Operation(&this->super_Operation,"CreateProgram",useSync,serverSync);
  (this->super_Operation).super_Operation._vptr_Operation =
       (_func_int **)&PTR__CreateProgram_02154068;
  (this->m_program).m_ptr = (Program *)0x0;
  (this->m_program).m_state = (SharedPtrStateBase *)0x0;
  this_00 = (Program *)operator_new(0x90);
  local_40.m_ptr = (this->super_Operation).super_Operation.m_event.m_ptr;
  local_40.m_state = (this->super_Operation).super_Operation.m_event.m_state;
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_40.m_state)->strongRefCount = (local_40.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_40.m_state)->weakRefCount = (local_40.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  local_50.m_ptr = (this->super_Operation).m_sync.m_ptr;
  local_50.m_state = (this->super_Operation).m_sync.m_state;
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    (local_50.m_state)->strongRefCount = (local_50.m_state)->strongRefCount + 1;
    UNLOCK();
    LOCK();
    (local_50.m_state)->weakRefCount = (local_50.m_state)->weakRefCount + 1;
    UNLOCK();
  }
  GLES2ThreadTest::Program::Program(this_00,&local_40,&local_50);
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar3->strongRefCount;
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02154988;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)this_00;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  pSVar2 = program->m_state;
  if (pSVar2 != pSVar3) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar4 = &pSVar2->strongRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        program->m_ptr = (Program *)0x0;
        (*program->m_state->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar4 = &program->m_state->weakRefCount;
      *pdVar4 = *pdVar4 + -1;
      UNLOCK();
      if (*pdVar4 == 0) {
        if (program->m_state != (SharedPtrStateBase *)0x0) {
          (*program->m_state->_vptr_SharedPtrStateBase[1])();
        }
        program->m_state = (SharedPtrStateBase *)0x0;
      }
    }
    program->m_ptr = this_00;
    program->m_state = pSVar3;
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &program->m_state->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pdVar4 = &pSVar3->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar3->_vptr_SharedPtrStateBase[2])(pSVar3);
  }
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    (*pSVar3->_vptr_SharedPtrStateBase[1])(pSVar3);
  }
  if (local_50.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_50.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_50.m_ptr = (FenceSync *)0x0;
      (*(local_50.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_50.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_50.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_50.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_50.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_40.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &(local_40.m_state)->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      local_40.m_ptr = (Event *)0x0;
      (*(local_40.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &(local_40.m_state)->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_40.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_40.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_40.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  pSVar2 = (this->m_program).m_state;
  if (pSVar2 != program->m_state) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_program).m_ptr = (Program *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_program).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = program->m_ptr;
    pSVar2 = program->m_state;
    (this->m_program).m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_program).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return;
}

Assistant:

CreateProgram::CreateProgram (SharedPtr<Program>& program, bool useSync, bool serverSync)
	: Operation	("CreateProgram", useSync, serverSync)
{
	program = SharedPtr<Program>(new Program(getEvent(), getSync()));
	m_program = program;
}